

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

bool __thiscall
helics::Federate::checkValidFilterType
          (Federate *this,bool useTypes,FilterTypes opType,string *operation)

{
  int iVar1;
  InvalidParameter *this_00;
  HelicsException *this_01;
  undefined7 in_register_00000031;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view fmt;
  string_view message_02;
  string_view message_03;
  string_view fmt_00;
  string_view message_04;
  format_args args;
  format_args args_00;
  string emessage;
  string local_48;
  pointer local_28;
  size_type sStack_20;
  
  if ((int)CONCAT71(in_register_00000031,useTypes) == 0) {
    if (opType != UNRECOGNIZED) {
      return true;
    }
    if (this->strictConfigChecking == true) {
      local_28 = (operation->_M_dataplus)._M_p;
      sStack_20 = operation->_M_string_length;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x20;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_28;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_48,(v11 *)"unrecognized filter operation:{}",fmt_00,args_00);
      message_04._M_str = local_48._M_dataplus._M_p;
      message_04._M_len = local_48._M_string_length;
      logMessage(this,0,message_04);
      this_01 = (HelicsException *)__cxa_allocate_exception(0x28);
      message_00._M_str = local_48._M_dataplus._M_p;
      message_00._M_len = local_48._M_string_length;
      HelicsException::HelicsException(this_01,message_00);
      *(undefined ***)this_01 = &PTR__HelicsException_00541a58;
      __cxa_throw(this_01,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    local_28 = (operation->_M_dataplus)._M_p;
    sStack_20 = operation->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x20;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_28;
    ::fmt::v11::vformat_abi_cxx11_(&local_48,(v11 *)"unrecognized filter operation:{}",fmt,args);
    message_02._M_str = local_48._M_dataplus._M_p;
    message_02._M_len = local_48._M_string_length;
    logMessage(this,3,message_02);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operation,
                    "custom");
    if (iVar1 == 0) {
      return true;
    }
    if (this->strictConfigChecking == true) {
      message_03._M_str = "input and output types may only be specified for custom filters";
      message_03._M_len = 0x3f;
      logMessage(this,0,message_03);
      this_00 = (InvalidParameter *)__cxa_allocate_exception(0x28);
      message._M_str = "input and output types may only be specified for custom filters";
      message._M_len = 0x3f;
      InvalidParameter::InvalidParameter(this_00,message);
      __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    message_01._M_str = "input and output types may only be specified for custom filters";
    message_01._M_len = 0x3f;
    logMessage(this,3,message_01);
  }
  return false;
}

Assistant:

bool Federate::checkValidFilterType(bool useTypes,
                                    FilterTypes opType,
                                    const std::string& operation) const
{
    if ((useTypes) && (operation != "custom")) {
        if (strictConfigChecking) {
            logMessage(HELICS_LOG_LEVEL_ERROR,
                       "input and output types may only be specified for custom filters");
            throw(InvalidParameter(
                "input and output types may only be specified for custom filters"));
        }
        logMessage(HELICS_LOG_LEVEL_WARNING,
                   "input and output types may only be specified for custom filters");
        return false;
    }
    if (!useTypes) {
        if (opType == FilterTypes::UNRECOGNIZED) {
            if (strictConfigChecking) {
                const std::string emessage =
                    fmt::format("unrecognized filter operation:{}", operation);
                logMessage(HELICS_LOG_LEVEL_ERROR, emessage);

                throw(InvalidParameter(emessage));
            }
            logMessage(HELICS_LOG_LEVEL_WARNING,
                       fmt::format("unrecognized filter operation:{}", operation));
            return false;
        }
    }
    return true;
}